

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::checkRemoveSamplerString(CLIntercept *this,cl_sampler sampler)

{
  cl_uint cVar1;
  cl_sampler in_RDI;
  cl_uint refCount;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
             ,(mutex_type *)in_RDI);
  cVar1 = getRefCount((CLIntercept *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_RDI);
  if (cVar1 == 1) {
    std::
    map<_cl_sampler_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<_cl_sampler_*>,_std::allocator<std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::erase((map<_cl_sampler_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<_cl_sampler_*>,_std::allocator<std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)CONCAT44(in_stack_ffffffffffffffd4,1),(key_type *)in_RDI);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20a8f5);
  return;
}

Assistant:

void CLIntercept::checkRemoveSamplerString(
    cl_sampler sampler )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_uint refCount = getRefCount( sampler );
    if( refCount == 1 )
    {
        m_SamplerDataMap.erase( sampler );
    }
}